

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O3

void readTiledRgba1(char *fileName,Array2D<Imf_2_5::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  Box2i *pBVar3;
  Rgba *pRVar4;
  size_t yStride;
  long lVar5;
  long lVar6;
  size_t sVar7;
  TiledRgbaInputFile in;
  TiledRgbaInputFile local_68;
  
  iVar1 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile(&local_68,fileName,iVar1);
  pBVar3 = Imf_2_5::TiledRgbaInputFile::dataWindow(&local_68);
  iVar1 = (pBVar3->min).x;
  lVar5 = (long)(pBVar3->min).y;
  iVar2 = (pBVar3->max).y;
  *width = ((pBVar3->max).x - iVar1) + 1;
  lVar6 = (iVar2 - lVar5) + 1;
  *height = (int)lVar6;
  sVar7 = (size_t)*width;
  pRVar4 = (Rgba *)operator_new__(-(ulong)(sVar7 * lVar6 >> 0x3d != 0) | sVar7 * lVar6 * 8);
  yStride = sVar7;
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
    yStride = (size_t)*width;
  }
  pixels->_sizeX = lVar6;
  pixels->_sizeY = sVar7;
  pixels->_data = pRVar4;
  Imf_2_5::TiledRgbaInputFile::setFrameBuffer
            (&local_68,pRVar4 + -lVar5 * sVar7 + (long)-iVar1,1,yStride);
  iVar1 = Imf_2_5::TiledRgbaInputFile::numXTiles(&local_68,0);
  iVar2 = Imf_2_5::TiledRgbaInputFile::numYTiles(&local_68,0);
  Imf_2_5::TiledRgbaInputFile::readTiles(&local_68,0,iVar1 + -1,0,iVar2 + -1,0);
  Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile(&local_68);
  return;
}

Assistant:

void
readTiledRgba1 (const char fileName[],
                Array2D<Rgba> &pixels,
                int &width,
                int &height)
{
    TiledRgbaInputFile in (fileName);
    Box2i dw = in.dataWindow();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    pixels.resizeErase (height, width);

    in.setFrameBuffer (&pixels[-dy][-dx], 1, width);
    in.readTiles (0, in.numXTiles() - 1, 0, in.numYTiles() - 1);
}